

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_colour.c
# Opt level: O3

int main(void)

{
  int iVar1;
  HRESULT HVar2;
  DecklinkDisplayMode displayMode;
  cdecklink_iterator_t_conflict *obj;
  long lVar3;
  long lVar4;
  cdecklink_video_frame_t_conflict *obj_00;
  int iVar5;
  char *__s;
  uint uVar6;
  cdecklink_display_mode_t *mode;
  int index;
  cdecklink_display_mode_iterator_t *mode_iterator;
  cdecklink_output_t *output;
  uint8_t *bytes;
  cdecklink_mutable_video_frame_t *mutable_frame;
  char *name;
  char *display_name;
  cdecklink_display_mode_t_conflict *local_78;
  int local_6c;
  cdecklink_display_mode_iterator_t_conflict *local_68;
  cdecklink_output_t_conflict *local_60;
  cdecklink_device_t_conflict *local_58;
  void *local_50;
  cdecklink_mutable_video_frame_t_conflict *local_48;
  char *local_40;
  char *local_38;
  
  obj = cdecklink_create_decklink_iterator_instance();
  if (obj == (cdecklink_iterator_t_conflict *)0x0) goto LAB_001024de;
  local_6c = 3;
  printf("Choose decklink device to output to: ");
  putchar(10);
  __isoc99_scanf("%d",&local_6c);
  local_58 = (cdecklink_device_t_conflict *)0x0;
  HVar2 = cdecklink_iterator_next(obj,&local_58);
  iVar5 = -1;
  if (HVar2 == 0) {
    iVar1 = 0;
    do {
      iVar5 = iVar1;
      if (iVar5 == local_6c) break;
      cdecklink_device_release(local_58);
      local_58 = (cdecklink_device_t_conflict *)0x0;
      HVar2 = cdecklink_iterator_next(obj,&local_58);
      iVar1 = iVar5 + 1;
    } while (HVar2 == 0);
  }
  if (local_58 == (cdecklink_device_t_conflict *)0x0 || iVar5 != local_6c) {
    __s = "Invalid device index";
  }
  else {
    HVar2 = cdecklink_device_get_display_name(local_58,&local_38);
    if (HVar2 < 0) {
      __s = "Failed to get device name";
    }
    else {
      printf("Selected device: %s\n",local_38);
      cdecklink_free_string(local_38);
      HVar2 = cdecklink_device_query_output(local_58,&local_60);
      if (HVar2 < 0) {
        __s = "Device does not support output";
      }
      else {
        HVar2 = cdecklink_output_get_display_mode_iterator(local_60,&local_68);
        if (HVar2 == 0) {
          puts("Select videomode:");
          HVar2 = cdecklink_display_mode_iterator_next(local_68,&local_78);
          if (HVar2 == 0) {
            uVar6 = 0;
            do {
              HVar2 = cdecklink_display_mode_get_name(local_78,&local_40);
              if (-1 < HVar2) {
                printf("%d: %s\n",(ulong)uVar6,local_40);
                cdecklink_free_string(local_40);
                cdecklink_display_mode_release(local_78);
                local_78 = (cdecklink_display_mode_t_conflict *)0x0;
                uVar6 = uVar6 + 1;
              }
              HVar2 = cdecklink_display_mode_iterator_next(local_68,&local_78);
            } while (HVar2 == 0);
          }
          cdecklink_display_mode_iterator_release(local_68);
          local_68 = (cdecklink_display_mode_iterator_t_conflict *)0x0;
          local_6c = 7;
          putchar(10);
          __isoc99_scanf("%d",&local_6c);
          HVar2 = cdecklink_output_get_display_mode_iterator(local_60,&local_68);
          if (HVar2 == 0) {
            HVar2 = cdecklink_display_mode_iterator_next(local_68,&local_78);
            if (HVar2 == 0) {
              iVar5 = -1;
              do {
                iVar5 = iVar5 + 1;
                if (iVar5 == local_6c) break;
                cdecklink_display_mode_release(local_78);
                local_78 = (cdecklink_display_mode_t_conflict *)0x0;
                HVar2 = cdecklink_display_mode_iterator_next(local_68,&local_78);
              } while (HVar2 == 0);
            }
            lVar3 = cdecklink_display_mode_get_width(local_78);
            lVar4 = cdecklink_display_mode_get_height(local_78);
            HVar2 = cdecklink_output_create_video_frame
                              (local_60,(int)lVar3,(int32_t)lVar4,(int)lVar3 * 4,0x42475241,0,
                               &local_48);
            if (HVar2 == 0) {
              obj_00 = cdecklink_video_input_frame_to_video_frame
                                 ((cdecklink_video_input_frame_t_conflict *)local_48);
              HVar2 = cdecklink_video_frame_get_bytes(obj_00,&local_50);
              if (HVar2 == 0) {
                lVar3 = lVar3 * lVar4 * 4;
                if (0 < lVar3) {
                  lVar4 = 0;
                  do {
                    *(undefined1 *)((long)local_50 + lVar4) = 0xff;
                    *(undefined1 *)((long)local_50 + lVar4 + 1) = 0x78;
                    *(undefined1 *)((long)local_50 + lVar4 + 2) = 0;
                    *(undefined1 *)((long)local_50 + lVar4 + 3) = 0xff;
                    lVar4 = lVar4 + 4;
                  } while (lVar4 < lVar3);
                }
                displayMode = cdecklink_display_mode_get_display_mode(local_78);
                HVar2 = cdecklink_output_enable_video_output(local_60,displayMode,0);
                if (HVar2 == 0) {
                  HVar2 = cdecklink_output_display_video_frame_sync(local_60,obj_00);
                  if (HVar2 == 0) {
                    sleep(1);
                    puts("Press Any Key to Continue");
                    __isoc99_scanf("%d",&local_6c);
                    goto LAB_001024de;
                  }
                  __s = "Failed to schedule frame";
                }
                else {
                  __s = "Failed to enable video output";
                }
              }
              else {
                __s = "Failed to get frame bytes";
              }
            }
            else {
              __s = "Failed to create output frame";
            }
            goto LAB_001024d9;
          }
        }
        __s = "Failed to create output mode iterator";
      }
    }
  }
LAB_001024d9:
  puts(__s);
LAB_001024de:
  if (local_48 != (cdecklink_mutable_video_frame_t_conflict *)0x0) {
    cdecklink_mutable_video_frame_release(local_48);
  }
  if (local_68 != (cdecklink_display_mode_iterator_t_conflict *)0x0) {
    cdecklink_display_mode_iterator_release(local_68);
  }
  if (local_60 != (cdecklink_output_t_conflict *)0x0) {
    cdecklink_output_release(local_60);
  }
  if (local_58 != (cdecklink_device_t_conflict *)0x0) {
    cdecklink_device_release(local_58);
  }
  if (obj != (cdecklink_iterator_t_conflict *)0x0) {
    cdecklink_iterator_release(obj);
  }
  return 0;
}

Assistant:

int main() {
    cdecklink_iterator_t *iterator = cdecklink_create_decklink_iterator_instance();
    if (!iterator)
        goto CLEANUP;

    int index = 3;
    printf("Choose decklink device to output to: ");
    printf("\n");
    scanf("%d", &index);

    // Fetch the selected device
    cdecklink_device_t *device = NULL;
    int i = -1;
    while (cdecklink_iterator_next(iterator, &device) == S_OK) {
        if (++i == index) {
            break;
        }

        cdecklink_device_release(device);
        device = NULL;
    }

    if (i != index || device == NULL) {
        printf("Invalid device index\n");
        goto CLEANUP;
    }

    const char *display_name;
    if (FAILED(cdecklink_device_get_display_name(device, &display_name))) {
        printf("Failed to get device name\n");
        goto CLEANUP;
    }
    printf("Selected device: %s\n", display_name);
    cdecklink_free_string(display_name);

    cdecklink_output_t *output;
    if (FAILED(cdecklink_device_query_output(device, &output))) {
        printf("Device does not support output\n");
        goto CLEANUP;
    }

    // List the supported modes
    cdecklink_display_mode_iterator_t *mode_iterator;
    if (cdecklink_output_get_display_mode_iterator(output, &mode_iterator) != S_OK) {
        printf("Failed to create output mode iterator\n");
        goto CLEANUP;
    }

    printf("Select videomode:\n");
    cdecklink_display_mode_t *mode;
    int mode_i = 0;
    while (cdecklink_display_mode_iterator_next(mode_iterator, &mode) == S_OK) {
        const char *name;
        if (FAILED(cdecklink_display_mode_get_name(mode, &name))) {
            // TODO
        } else {
            printf("%d: %s\n", mode_i++, name);
            cdecklink_free_string(name);
            cdecklink_display_mode_release(mode);
            mode = NULL;
        }
    }
    cdecklink_display_mode_iterator_release(mode_iterator);
    mode_iterator = NULL;

    index = 7;
    printf("\n");
    scanf("%d", &index);

    // Fetch the selected mode
    if (cdecklink_output_get_display_mode_iterator(output, &mode_iterator) != S_OK) {
        printf("Failed to create output mode iterator\n");
        goto CLEANUP;
    }
    mode_i = -1;
    while (cdecklink_display_mode_iterator_next(mode_iterator, &mode) == S_OK) {
        if (++mode_i == index) {
            break;
        }
        cdecklink_display_mode_release(mode);
        mode = NULL;
    }

    // Create a frame
    long width = cdecklink_display_mode_get_width(mode);
    long height = cdecklink_display_mode_get_height(mode);
    cdecklink_mutable_video_frame_t *mutable_frame;
    if (cdecklink_output_create_video_frame(output, width, height, width * 4, decklinkFormat8BitBGRA,
                                                   decklinkFrameFlagDefault, &mutable_frame) != S_OK) {
        printf("Failed to create output frame\n");
        goto CLEANUP;
    }
    cdecklink_video_frame_t *frame = cdecklink_video_input_frame_to_video_frame(mutable_frame);

    // Fill the frame
    uint8_t *bytes;
    if (cdecklink_video_frame_get_bytes(frame, (void **) (&bytes)) != S_OK) {
        printf("Failed to get frame bytes\n");
        goto CLEANUP;
    }
    for (int o = 0; o < width * height * 4; o += 4) {
        bytes[o] = 255;
        bytes[o + 1] = 120;
        bytes[o + 2] = 0;
        bytes[o + 3] = 255;
    }

    DecklinkDisplayMode mode2 = cdecklink_display_mode_get_display_mode(mode);
    if (cdecklink_output_enable_video_output(output, mode2, decklinkVideoOutputFlagDefault) != S_OK) {
        printf("Failed to enable video output\n");
        goto CLEANUP;
    }

    // Schedule frame
    if (cdecklink_output_display_video_frame_sync(output, frame) != S_OK) {
        printf("Failed to schedule frame\n");
        goto CLEANUP;
    }

    // Wait for termination
    sleep(1);
    printf("Press Any Key to Continue\n");
    scanf("%d", &index);

    CLEANUP:

    if (mutable_frame)
        cdecklink_mutable_video_frame_release(mutable_frame);

    if (mode_iterator)
        cdecklink_display_mode_iterator_release(mode_iterator);

    if (output)
        cdecklink_output_release(output);

    if (device)
        cdecklink_device_release(device);

    if (iterator)
        cdecklink_iterator_release(iterator);

    return 0;
}